

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::Pooling3DLayerParams::Pooling3DLayerParams
          (Pooling3DLayerParams *this,Pooling3DLayerParams *from)

{
  void *pvVar1;
  int32 iVar2;
  bool bVar3;
  undefined3 uVar4;
  int iVar5;
  int32 iVar6;
  int32 iVar7;
  int32 iVar8;
  int32 iVar9;
  int32 iVar10;
  int32 iVar11;
  int32 iVar12;
  int32 iVar13;
  int iVar14;
  int32 iVar15;
  int32 iVar16;
  int32 iVar17;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Pooling3DLayerParams_003bbbd0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar14 = from->type_;
  iVar15 = from->kerneldepth_;
  iVar16 = from->kernelheight_;
  iVar17 = from->kernelwidth_;
  iVar10 = from->stridedepth_;
  iVar11 = from->strideheight_;
  iVar12 = from->stridewidth_;
  iVar13 = from->custompaddingfront_;
  iVar6 = from->custompaddingback_;
  iVar7 = from->custompaddingtop_;
  iVar8 = from->custompaddingbottom_;
  iVar9 = from->custompaddingleft_;
  iVar2 = from->custompaddingright_;
  bVar3 = from->countexcludepadding_;
  uVar4 = *(undefined3 *)&from->field_0x45;
  iVar5 = from->paddingtype_;
  this->custompaddingleft_ = from->custompaddingleft_;
  this->custompaddingright_ = iVar2;
  this->countexcludepadding_ = bVar3;
  *(undefined3 *)&this->field_0x45 = uVar4;
  this->paddingtype_ = iVar5;
  this->custompaddingback_ = iVar6;
  this->custompaddingtop_ = iVar7;
  this->custompaddingbottom_ = iVar8;
  this->custompaddingleft_ = iVar9;
  this->stridedepth_ = iVar10;
  this->strideheight_ = iVar11;
  this->stridewidth_ = iVar12;
  this->custompaddingfront_ = iVar13;
  this->type_ = iVar14;
  this->kerneldepth_ = iVar15;
  this->kernelheight_ = iVar16;
  this->kernelwidth_ = iVar17;
  return;
}

Assistant:

Pooling3DLayerParams::Pooling3DLayerParams(const Pooling3DLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&type_, &from.type_,
    reinterpret_cast<char*>(&paddingtype_) -
    reinterpret_cast<char*>(&type_) + sizeof(paddingtype_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Pooling3DLayerParams)
}